

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6d54c::TargetTask::inputsAvailable(TargetTask *this,TaskInterface ti)

{
  uint uVar1;
  void **ppvVar2;
  Twine *pTVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  _func_int *p_Var6;
  Child CVar7;
  Child CVar8;
  bool bVar9;
  raw_ostream *prVar10;
  BuildEngineDelegate *pBVar11;
  uint *puVar12;
  NodeKind NVar13;
  Child CVar14;
  Child CVar15;
  Child CVar16;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  iterator __begin3;
  string inputs;
  raw_string_ostream inputsStream;
  Child local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  Child local_188;
  Child CStack_180;
  undefined8 local_178;
  Child local_168;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined8 local_158;
  string local_150;
  uint local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  NodeKind local_120;
  char cStack_11f;
  undefined6 uStack_11e;
  uint local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  NodeKind local_108;
  char cStack_107;
  undefined6 uStack_106;
  uint local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  NodeKind local_f0;
  char cStack_ef;
  undefined6 uStack_ee;
  Child local_e8;
  void *pvStack_e0;
  uint local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  NodeKind local_c8;
  char cStack_c7;
  undefined6 uStack_c6;
  BuildValue local_c0;
  StringRef local_50;
  undefined8 local_40;
  undefined4 local_38;
  
  pvStack_e0 = ti.ctx;
  local_e8 = (Child)ti.impl;
  bVar9 = llbuild::core::TaskInterface::isCancelled((TaskInterface *)&local_e8);
  if (bVar9) {
    local_c0.kind = SkippedCommand;
    goto LAB_0012f31c;
  }
  uVar1 = (this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
          super_SmallPtrSetImplBase.NumNonEmpty;
  if (uVar1 != (this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
               super_SmallPtrSetImplBase.NumTombstones) {
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    local_150._M_string_length = 0;
    local_150.field_2._M_local_buf[0] = '\0';
    local_c0.valueData.asOutputInfo.mode._0_4_ = 1;
    local_c0.signature.value._0_4_ = 0;
    local_c0.signature.value._4_4_ = 0;
    local_c0.valueData.asOutputInfo.device._0_4_ = 0;
    local_c0.valueData.asOutputInfo.device._4_4_ = 0;
    local_c0.valueData.asOutputInfo.inode._0_4_ = 0;
    local_c0.valueData.asOutputInfo.inode._4_4_ = 0;
    local_c0.kind = 0x1e8078;
    local_c0.numOutputInfos = 0;
    local_c0.valueData.asOutputInfo.size = (uint64_t)&local_150;
    local_188 = (Child)(this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>
                       .super_SmallPtrSetImplBase.CurArray;
    if (local_188.twine !=
        (Twine *)(this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
                 super_SmallPtrSetImplBase.SmallArray) {
      uVar1 = (this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
              super_SmallPtrSetImplBase.CurArraySize;
    }
    CStack_180.decUL = (unsigned_long *)(&(local_188.twine)->LHS + uVar1);
    llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid((SmallPtrSetIteratorImpl *)&local_188);
    local_1a8.twine = local_188.twine;
    uStack_1a0 = CStack_180.twine;
    ppvVar2 = (this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
              super_SmallPtrSetImplBase.CurArray;
    puVar12 = &(this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
               super_SmallPtrSetImplBase.NumNonEmpty;
    if (ppvVar2 !=
        (this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
        super_SmallPtrSetImplBase.SmallArray) {
      puVar12 = &(this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
                 super_SmallPtrSetImplBase.CurArraySize;
    }
    local_188.decUL = (unsigned_long *)(ppvVar2 + *puVar12);
    CStack_180.decUL = local_188.decUL;
    llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid((SmallPtrSetIteratorImpl *)&local_188);
    CVar15 = local_188;
    if (local_1a8.twine != local_188.twine) {
      do {
        if (uStack_1a0 <= local_1a8.twine) {
LAB_0012f38e:
          __assert_fail("Bucket < End",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                        ,0x122,
                        "const PtrTy llvm::SmallPtrSetIterator<llbuild::buildsystem::Node *>::operator*() const [PtrTy = llbuild::buildsystem::Node *]"
                       );
        }
        pTVar3 = (Twine *)*local_1a8.decUL;
        local_188 = (Child)(this->missingInputNodes).
                           super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
                           super_SmallPtrSetImplBase.CurArray;
        CStack_180.decUL =
             (unsigned_long *)
             (&(local_188.twine)->LHS +
             *(uint *)((long)(this->missingInputNodes).SmallStorage +
                      (ulong)(local_188.twine ==
                             (Twine *)(this->missingInputNodes).
                                      super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>.
                                      super_SmallPtrSetImplBase.SmallArray) * 4 + -0x10));
        llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid((SmallPtrSetIteratorImpl *)&local_188);
        if (CStack_180.twine <= local_188.twine) goto LAB_0012f38e;
        if (pTVar3 != ((Child *)&(local_188.stringRef)->Data)->twine) {
          Str.Length = 2;
          Str.Data = ", ";
          llvm::raw_ostream::operator<<((raw_ostream *)&local_c0,Str);
        }
        Str_00.Length = 1;
        Str_00.Data = "\'";
        prVar10 = llvm::raw_ostream::operator<<((raw_ostream *)&local_c0,Str_00);
        prVar10 = llvm::raw_ostream::operator<<(prVar10,*(StringRef *)&pTVar3->RHS);
        Str_01.Length = 1;
        Str_01.Data = "\'";
        llvm::raw_ostream::operator<<(prVar10,Str_01);
        local_1a8.twine = (Twine *)&(local_1a8.stdString)->_M_string_length;
        llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid((SmallPtrSetIteratorImpl *)&local_1a8);
      } while (local_1a8.twine != CVar15.twine);
    }
    if (CONCAT44(local_c0.valueData.asOutputInfo.inode._4_4_,
                 local_c0.valueData.asOutputInfo.inode._0_4_) !=
        CONCAT44(local_c0.signature.value._4_4_,(undefined4)local_c0.signature.value)) {
      llvm::raw_ostream::flush_nonempty((raw_ostream *)&local_c0);
    }
    local_188 = local_e8;
    CStack_180 = (Child)pvStack_e0;
    pBVar11 = llbuild::core::TaskInterface::delegate((TaskInterface *)&local_188);
    pp_Var4 = pBVar11[1]._vptr_BuildEngineDelegate;
    p_Var5 = pp_Var4[3];
    p_Var6 = pp_Var4[4];
    llvm::Twine::Twine((Twine *)&local_d8,"cannot build target \'");
    local_50.Data = (this->target->name)._M_dataplus._M_p;
    local_50.Length = (this->target->name)._M_string_length;
    llvm::Twine::Twine((Twine *)&local_100,&local_50);
    if ((local_c8 == NullKind) || (local_f0 == NullKind)) {
      local_158 = CONCAT62(local_158._2_6_,0x100);
    }
    else if (local_c8 == EmptyKind) {
      local_158 = CONCAT62(uStack_ee,CONCAT11(cStack_ef,local_f0));
      local_168.decUI = local_100;
      local_168._4_4_ = uStack_fc;
      uStack_160 = uStack_f8;
      uStack_15c = uStack_f4;
    }
    else if (local_f0 == EmptyKind) {
      local_158 = CONCAT62(uStack_c6,CONCAT11(cStack_c7,local_c8));
      local_168.decUI = local_d8;
      local_168._4_4_ = uStack_d4;
      uStack_160 = uStack_d0;
      uStack_15c = uStack_cc;
    }
    else {
      CVar15._4_4_ = uStack_d4;
      CVar15.decUI = local_d8;
      if (cStack_c7 != '\x01') {
        local_c8 = TwineKind;
        CVar15.twine = (Twine *)&local_d8;
      }
      if (cStack_ef != '\x01') {
        local_f0 = TwineKind;
      }
      CVar16._4_4_ = uStack_fc;
      CVar16.decUI = local_100;
      CVar14.twine = (Twine *)&local_100;
      if (cStack_ef == '\x01') {
        CVar14 = CVar16;
      }
      llvm::Twine::Twine((Twine *)&local_168,CVar15,local_c8,CVar14,local_f0);
    }
    llvm::Twine::Twine((Twine *)&local_118,"\' due to missing inputs: ");
    if (((NodeKind)local_158 == NullKind) || (local_108 == NullKind)) {
      local_198 = CONCAT62(local_198._2_6_,0x100);
    }
    else {
      if ((NodeKind)local_158 == EmptyKind) {
        local_198 = CONCAT62(uStack_106,CONCAT11(cStack_107,local_108));
      }
      else {
        if (local_108 != EmptyKind) {
          CVar14._4_4_ = local_168._4_4_;
          CVar14.decUI = local_168.decUI;
          NVar13 = (NodeKind)local_158;
          if (local_158._1_1_ != '\x01') {
            CVar14.twine = (Twine *)&local_168;
            NVar13 = TwineKind;
          }
          if (cStack_107 != '\x01') {
            local_108 = TwineKind;
          }
          CVar8._4_4_ = uStack_114;
          CVar8.decUI = local_118;
          CVar15.twine = (Twine *)&local_118;
          if (cStack_107 == '\x01') {
            CVar15 = CVar8;
          }
          llvm::Twine::Twine((Twine *)&local_1a8,CVar14,NVar13,CVar15,local_108);
          goto LAB_0012f20d;
        }
        local_198 = local_158;
        local_118 = local_168.decUI;
        uStack_114 = local_168._4_4_;
        uStack_110 = uStack_160;
        uStack_10c = uStack_15c;
      }
      local_1a8._4_4_ = uStack_114;
      local_1a8.decUI = local_118;
      uStack_1a0 = (Twine *)CONCAT44(uStack_10c,uStack_110);
    }
LAB_0012f20d:
    llvm::Twine::Twine((Twine *)&local_130,&local_150);
    if (((NodeKind)local_198 == NullKind) || (local_120 == NullKind)) {
      local_178 = CONCAT62(local_178._2_6_,0x100);
    }
    else {
      if ((NodeKind)local_198 == EmptyKind) {
        local_178 = CONCAT62(uStack_11e,CONCAT11(cStack_11f,local_120));
      }
      else {
        if (local_120 != EmptyKind) {
          CVar15 = local_1a8;
          NVar13 = (NodeKind)local_198;
          if (local_198._1_1_ != '\x01') {
            CVar15.twine = (Twine *)&local_1a8;
            NVar13 = TwineKind;
          }
          if (cStack_11f != '\x01') {
            local_120 = TwineKind;
          }
          CVar7._4_4_ = uStack_12c;
          CVar7.decUI = local_130;
          CVar16.twine = (Twine *)&local_130;
          if (cStack_11f == '\x01') {
            CVar16 = CVar7;
          }
          llvm::Twine::Twine((Twine *)&local_188,CVar15,NVar13,CVar16,local_120);
          goto LAB_0012f2b0;
        }
        local_178 = local_198;
        local_130 = local_1a8.decUI;
        uStack_12c = local_1a8._4_4_;
        uStack_128 = (undefined4)uStack_1a0;
        uStack_124 = uStack_1a0._4_4_;
      }
      local_188._4_4_ = uStack_12c;
      local_188.decUI = local_130;
      CStack_180._4_4_ = uStack_124;
      CStack_180.decUI = uStack_128;
    }
LAB_0012f2b0:
    local_40 = 0;
    local_38 = 0;
    (**(code **)(*(long *)pp_Var4[1] + 0x18))(pp_Var4[1],p_Var5,p_Var6,&local_40,&local_188);
    (**(code **)(*(long *)pp_Var4[1] + 0x30))();
    llvm::raw_string_ostream::~raw_string_ostream((raw_string_ostream *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                               local_150.field_2._M_local_buf[0]) + 1);
    }
  }
  local_c0.kind = Target;
LAB_0012f31c:
  local_c0.numOutputInfos = 0;
  local_c0.signature.value._0_4_ = 0;
  local_c0.signature.value._4_4_ = 0;
  local_c0.valueData.asOutputInfo.device._0_4_ = 0;
  local_c0.valueData.asOutputInfo.device._4_4_ = 0;
  local_c0.valueData.asOutputInfo.inode._0_4_ = 0;
  local_c0.valueData.asOutputInfo.inode._4_4_ = 0;
  local_c0.valueData.asOutputInfo.mode._0_4_ = 0;
  local_c0.valueData.asOutputInfo.mode._4_4_ = 0;
  local_c0.valueData.asOutputInfo.size._0_4_ = 0;
  local_c0.valueData.asOutputInfo.size._4_4_ = 0;
  local_c0.valueData.asOutputInfo.modTime.seconds._0_4_ = 0;
  local_c0.valueData._36_8_ = 0;
  local_c0.valueData._44_8_ = 0;
  local_c0.valueData._52_8_ = 0;
  local_c0.valueData._60_8_ = 0;
  local_c0.valueData._68_8_ = 0;
  local_c0.valueData._76_4_ = 0;
  local_c0.stringValues.contents._0_4_ = 0;
  local_c0.stringValues.contents._4_4_ = 0;
  local_c0.stringValues.size = 0;
  llbuild::buildsystem::BuildValue::toData((ValueType *)&local_150,&local_c0);
  llbuild::core::TaskInterface::complete((TaskInterface *)&local_e8,(ValueType *)&local_150,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_150._M_dataplus._M_p,
                    CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                             local_150.field_2._M_local_buf[0]) - (long)local_150._M_dataplus._M_p);
  }
  llbuild::buildsystem::BuildValue::~BuildValue(&local_c0);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // If the build should cancel, do nothing.
    if (ti.isCancelled()) {
      ti.complete(BuildValue::makeSkippedCommand().toData());
      return;
    }

    if (!missingInputNodes.empty()) {
      std::string inputs;
      raw_string_ostream inputsStream(inputs);
      for (Node* missingInputNode : missingInputNodes) {
        if (missingInputNode != *missingInputNodes.begin()) {
          inputsStream << ", ";
        }
        inputsStream << "'" << missingInputNode->getName() << "'";
      }
      inputsStream.flush();

      // FIXME: Design the logging and status output APIs.
      auto& system = getBuildSystem(ti);
      system.error(system.getMainFilename(),
                   (Twine("cannot build target '") + target.getName() +
                    "' due to missing inputs: " + inputs));
      
      // Report the command failure.
      system.getDelegate().hadCommandFailure();
    }
    
    // Complete the task immediately.
    ti.complete(BuildValue::makeTarget().toData());
  }